

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::ConcatParameter::InternalSwap(ConcatParameter *this,ConcatParameter *other)

{
  uint32 uVar1;
  int32 iVar2;
  int iVar3;
  void *pvVar4;
  UnknownFieldSet *other_00;
  
  uVar1 = this->concat_dim_;
  this->concat_dim_ = other->concat_dim_;
  other->concat_dim_ = uVar1;
  iVar2 = this->axis_;
  this->axis_ = other->axis_;
  other->axis_ = iVar2;
  uVar1 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar1;
  pvVar4 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar4 & 1) == 0) goto LAB_0049a4e5;
LAB_0049a4d8:
    other_00 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar4 & 1) != 0) goto LAB_0049a4d8;
    other_00 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00)
  ;
LAB_0049a4e5:
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void ConcatParameter::InternalSwap(ConcatParameter* other) {
  std::swap(concat_dim_, other->concat_dim_);
  std::swap(axis_, other->axis_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}